

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2c-test.cpp
# Opt level: O3

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  size_t *psVar1;
  byte bVar2;
  int iVar3;
  _List_node_base *p_Var4;
  uint uVar5;
  CommandOptions *this_00;
  ulong uVar6;
  allocator<char> local_61;
  _List_node_base *local_60;
  CommandOptions *local_58;
  _List_node_base *local_50;
  bool local_48;
  undefined7 uStack_47;
  _List_node_base *p_Stack_40;
  _List_node_base *local_38;
  
  this->error_flag = true;
  local_60 = (_List_node_base *)&this->filename_list;
  this->version_flag = false;
  this->verbose_flag = false;
  this->detail_flag = false;
  this->help_flag = false;
  (this->filename_list).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = local_60;
  (this->filename_list).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = local_60;
  (this->filename_list).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this_00 = this;
  local_38 = (_List_node_base *)argv;
  if (1 < argc) {
    uVar6 = 1;
    do {
      p_Var4 = (&local_38->_M_next)[uVar6];
      if (*(char *)&p_Var4->_M_next == '-') {
        bVar2 = *(byte *)((long)&p_Var4->_M_next + 1);
        uVar5 = (uint)(char)bVar2;
        this_00 = (CommandOptions *)(ulong)uVar5;
        iVar3 = isalpha(uVar5);
        if ((iVar3 == 0) || (*(char *)((long)&p_Var4->_M_next + 2) != '\0')) goto LAB_00104d1c;
        if (bVar2 < 0x72) {
          if (bVar2 == 0x56) {
            this->version_flag = true;
          }
          else {
            if (bVar2 != 0x68) {
LAB_00104e13:
              fprintf(_stderr,"Unrecognized option: %c\n",(ulong)uVar5);
              return;
            }
            this->help_flag = true;
          }
        }
        else if (bVar2 == 0x72) {
          this->detail_flag = true;
        }
        else {
          if (bVar2 != 0x76) goto LAB_00104e13;
          this->verbose_flag = true;
        }
      }
      else {
LAB_00104d1c:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,(char *)p_Var4,&local_61);
        p_Var4 = (_List_node_base *)operator_new(0x30);
        p_Var4[1]._M_next = p_Var4 + 2;
        if (local_58 == (CommandOptions *)&local_48) {
          p_Var4[2]._M_next = (_List_node_base *)CONCAT71(uStack_47,local_48);
          p_Var4[2]._M_prev = p_Stack_40;
        }
        else {
          p_Var4[1]._M_next = (_List_node_base *)local_58;
          p_Var4[2]._M_next = (_List_node_base *)CONCAT71(uStack_47,local_48);
        }
        p_Var4[1]._M_prev = local_50;
        local_50 = (_List_node_base *)0x0;
        local_48 = false;
        local_58 = (CommandOptions *)&local_48;
        std::__detail::_List_node_base::_M_hook(p_Var4);
        psVar1 = &(this->filename_list).
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        this_00 = local_58;
        if (local_58 != (CommandOptions *)&local_48) {
          operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
        }
      }
      uVar6 = uVar6 + 1;
    } while ((uint)argc != uVar6);
    if ((((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_60->_M_next)->_M_impl)._M_node.super__List_node_base._M_next != local_60) {
      this->error_flag = false;
      return;
    }
  }
  CommandOptions(this_00);
  return;
}

Assistant:

CommandOptions(int argc, const char** argv) :
    error_flag(true), version_flag(false), verbose_flag(false),
    detail_flag(false), help_flag(false)
  {
    for ( int i = 1; i < argc; i++ )
      {
	if ( argv[i][0] == '-' && isalpha(argv[i][1]) && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case 'V': version_flag = true; break;
	      case 'h': help_flag = true; break;
	      case 'r': detail_flag = true; break;
	      case 'v': verbose_flag = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %c\n", argv[i][1]);
		return;
	      }
	  }
	else
	  {
	    filename_list.push_back(argv[i]);
	  }
      }

    if ( filename_list.empty() )
      {
	fputs("Input j2c filename(s) required.\n", stderr);
	return;
      }

    error_flag = false;
  }